

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharScanner.cpp
# Opt level: O1

void __thiscall antlr::CharScanner::traceOut(CharScanner *this,char *rname)

{
  int iVar1;
  size_t sVar2;
  long *plVar3;
  
  (*(this->super_TokenStream)._vptr_TokenStream[0x2f])();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"< lexer ",8);
  if (rname == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x3184a0);
  }
  else {
    sVar2 = strlen(rname);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,rname,sVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"; c==",5);
  iVar1 = (*(this->super_TokenStream)._vptr_TokenStream[3])(this,1);
  plVar3 = (long *)std::ostream::operator<<(&std::cout,iVar1);
  std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
  std::ostream::put((char)plVar3);
  std::ostream::flush();
  this->traceDepth = this->traceDepth + -1;
  return;
}

Assistant:

void CharScanner::traceOut(const char* rname)
{
	traceIndent();
	ANTLR_USE_NAMESPACE(std)cout << "< lexer " << rname
		<< "; c==" << LA(1) << ANTLR_USE_NAMESPACE(std)endl;
	traceDepth--;
}